

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_rotr_i64_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  tcg_gen_op3_i64(tcg_ctx,INDEX_op_rotr_i64,ret,arg1,arg2);
  return;
}

Assistant:

void tcg_gen_rotr_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_HAS_rot_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_rotr_i64, ret, arg1, arg2);
#else
        TCGv_i64 t0, t1;
        t0 = tcg_temp_new_i64(tcg_ctx);
        t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shr_i64(tcg_ctx, t0, arg1, arg2);
        tcg_gen_subfi_i64(tcg_ctx, t1, 64, arg2);
        tcg_gen_shl_i64(tcg_ctx, t1, arg1, t1);
        tcg_gen_or_i64(tcg_ctx, ret, t0, t1);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
}